

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O0

Class * __thiscall chatra::Reader::readClass(Reader *this)

{
  int iVar1;
  mapped_type *ppCVar2;
  unsigned_long __n;
  reference ppCVar3;
  IllegalArgumentException *this_00;
  Node *local_20;
  Reader *local_18;
  Reader *this_local;
  
  local_18 = this;
  iVar1 = read<int,_nullptr>(this);
  if (iVar1 == 0) {
    this_local = (Reader *)0x0;
  }
  else if (iVar1 == 1) {
    local_20 = read<chatra::Node_*,_nullptr>(this);
    ppCVar2 = std::
              unordered_map<chatra::Node_*,_const_chatra::Class_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::Class_*>_>_>
              ::at(&this->nodeClassMap,&local_20);
    this_local = (Reader *)*ppCVar2;
  }
  else {
    if (iVar1 != 2) {
      this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
      memset(this_00,0,0x28);
      IllegalArgumentException::IllegalArgumentException(this_00);
      __cxa_throw(this_00,&IllegalArgumentException::typeinfo,
                  IllegalArgumentException::~IllegalArgumentException);
    }
    __n = read<unsigned_long,_nullptr>(this);
    ppCVar3 = std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>::at
                        (&this->classMap,__n);
    this_local = (Reader *)*ppCVar3;
  }
  return (Class *)this_local;
}

Assistant:

const Class* Reader::readClass() {
	chatra_assert(entityMapEnabled);
	CHATRA_RESTORE_TYPE_TAG(Class);

	switch (read<int>()) {
	case 0:  return nullptr;
	case 1:  return nodeClassMap.at(read<Node*>());
	case 2:  return classMap.at(read<size_t>());
	default:
		throw IllegalArgumentException();
	}
}